

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall google::protobuf::internal::ExtensionSet::RemoveLast(ExtensionSet *this,int number)

{
  Extension *pEVar1;
  string_view str;
  LogMessage LStack_18;
  
  pEVar1 = FindOrNull(this,number);
  if (pEVar1 == (Extension *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_18,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x368,"extension != nullptr");
    str._M_str = "Index out-of-bounds (field is empty).";
    str._M_len = 0x25;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&LStack_18,str)
    ;
  }
  else {
    if (pEVar1->is_repeated == false) {
      RemoveLast((ExtensionSet *)&LStack_18);
    }
    else if (0xed < (byte)(pEVar1->type - 0x13)) {
      switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar1->type * 4)) {
      case 1:
      case 8:
        RepeatedField<int>::RemoveLast((RepeatedField<int> *)pEVar1->field_0);
        return;
      case 2:
        RepeatedField<long>::RemoveLast((RepeatedField<long> *)pEVar1->field_0);
        return;
      case 3:
        RepeatedField<unsigned_int>::RemoveLast((RepeatedField<unsigned_int> *)pEVar1->field_0);
        return;
      case 4:
        RepeatedField<unsigned_long>::RemoveLast((RepeatedField<unsigned_long> *)pEVar1->field_0);
        return;
      case 5:
        RepeatedField<double>::RemoveLast((RepeatedField<double> *)pEVar1->field_0);
        return;
      case 6:
        RepeatedField<float>::RemoveLast((RepeatedField<float> *)pEVar1->field_0);
        return;
      case 7:
        RepeatedField<bool>::RemoveLast((RepeatedField<bool> *)pEVar1->field_0);
        return;
      case 9:
        RepeatedPtrFieldBase::
        RemoveLast<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                  ((RepeatedPtrFieldBase *)pEVar1->field_0);
        return;
      case 10:
        RepeatedPtrFieldBase::
        RemoveLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                  ((RepeatedPtrFieldBase *)pEVar1->field_0);
        return;
      default:
        return;
      }
    }
    RemoveLast((ExtensionSet *)&LStack_18);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_18)
  ;
}

Assistant:

ExtensionSet::Extension* ExtensionSet::FindOrNull(int key) {
  const auto* const_this = this;
  return const_cast<ExtensionSet::Extension*>(const_this->FindOrNull(key));
}